

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O3

void * pstore::memory_mapper::mmap
                 (void *__addr,size_t __len,int __prot,int __flags,int __fd,__off_t __offset)

{
  int __fd_00;
  errno_erc erc;
  void *pvVar1;
  undefined8 *puVar2;
  int *piVar3;
  int in_register_0000000c;
  undefined4 in_register_00000084;
  ostringstream message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  size_t local_1c0;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_1b8;
  system_page_size local_1a8 [23];
  
  __fd_00 = *(int *)(__len + 0x28);
  local_1a8[0].super_system_page_size_interface._vptr_system_page_size_interface = (_func_int **)0x0
  ;
  local_1a8[0]._8_8_ = 0;
  local_1c0 = __len;
  system_page_size::system_page_size(local_1a8);
  if (CONCAT44(in_register_0000000c,__flags) % (local_1a8[0]._8_8_ & 0xffffffff) == 0) {
    system_page_size::~system_page_size(local_1a8);
    if (-1 < in_register_0000000c) {
      pvVar1 = ::mmap((void *)0x0,CONCAT44(in_register_00000084,__fd),__prot * 2 + 1,1,__fd_00,
                      CONCAT44(in_register_0000000c,__flags));
      if (pvVar1 != (void *)0xffffffffffffffff) {
        *(void **)__addr = pvVar1;
        *(undefined8 *)((long)__addr + 8) = 0;
        puVar2 = (undefined8 *)operator_new(0x20);
        puVar2[1] = 0x100000001;
        *puVar2 = &PTR___Sp_counted_base_00131ca0;
        puVar2[2] = CONCAT44(in_register_00000084,__fd);
        puVar2[3] = pvVar1;
        *(undefined8 **)((long)__addr + 8) = puVar2;
        return __addr;
      }
      piVar3 = __errno_location();
      erc.err_ = *piVar3;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Could not memory map file ",0x1a);
      local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0,*(long *)(local_1c0 + 8),
                 *(long *)(local_1c0 + 0x10) + *(long *)(local_1c0 + 8));
      local_1b8._M_delim = '\"';
      local_1b8._M_escape = '\0';
      local_1b8._M_string = &local_1e0;
      std::__detail::operator<<
                ((basic_ostream<char,_std::char_traits<char>_> *)local_1a8,&local_1b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::stringbuf::str();
      raise<pstore::errno_erc,std::__cxx11::string>(erc,&local_1e0);
    }
  }
  else {
    system_page_size::~system_page_size(local_1a8);
  }
  raise<std::errc,char[5]>(invalid_argument,(char (*) [5])"mmap");
}

Assistant:

std::shared_ptr<void> memory_mapper::mmap (file::file_handle & file, bool const write_enabled,
                                               std::uint64_t const offset,
                                               std::uint64_t const length) {
        void * const ptr = ::mmap (nullptr, // base address
                                   length,
                                   PROT_READ | (write_enabled ? PROT_WRITE : 0), // protection flags
                                   MAP_SHARED, file.raw_handle (), checked_offset (offset));
        void const * const map_failed = MAP_FAILED; // NOLINT
        if (ptr == map_failed) {
            int const last_error = errno;
            std::ostringstream message;
            message << "Could not memory map file " << pstore::quoted (file.path ());
            raise (errno_erc{last_error}, message.str ());
        }

        return std::shared_ptr<void> (ptr, [length] (void * const p) {
            if (::munmap (p, length) == -1) {
                raise (errno_erc{errno}, "munmap");
            }
        });
    }